

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base642midi.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *pppMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ostream *poVar4;
  size_t in_RCX;
  void *__buf;
  string filename;
  MidiFile midifile;
  Options opts;
  string local_190;
  MidiFile local_170;
  Options local_100;
  
  smf::Options::Options(&local_100);
  smf::Options::setOptions(&local_100,argc,argv);
  pppMVar1 = &local_170.m_events.
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_170.m_events.super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pppMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"o|output=s:test.mid","");
  paVar2 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Output filename","");
  smf::Options::define(&local_100,(string *)&local_170,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_170.m_events.
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppMVar1) {
    operator_delete(local_170.m_events.
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  smf::Options::process(&local_100,1,0);
  iVar3 = smf::Options::getArgCount(&local_100);
  if (iVar3 == 0) {
    local_170.m_events.
    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppMVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"output","");
    smf::Options::getString(&local_190,&local_100,(string *)&local_170);
    if (local_170.m_events.
        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppMVar1) {
      operator_delete(local_170.m_events.
                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    smf::MidiFile::MidiFile(&local_170);
    smf::MidiFile::readBase64(&local_170,(istream *)&std::cin);
    smf::MidiFile::write(&local_170,(int)&local_190,__buf,in_RCX);
    smf::MidiFile::~MidiFile(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    smf::Options::~Options(&local_100);
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Usage: cat base64.txt | ",0x18);
  smf::Options::getCommand_abi_cxx11_((string *)&local_170,&local_100);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,
                      (char *)local_170.m_events.
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_170.m_events.
                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," -o output.mid ",0xf);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_170);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	Options opts;
	opts.setOptions(argc, argv);
	opts.define("o|output=s:test.mid", "Output filename");
	opts.process();
	if (opts.getArgCount() != 0) {
		cerr << "Usage: cat base64.txt | " << opts.getCommand() << " -o output.mid " << endl;
		exit(1);
	}

	string filename = opts.getString("output");

	MidiFile midifile;
	midifile.readBase64(cin);
	midifile.write(filename);
	return 0;
}